

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O1

uint8_t __thiscall m6502::BMI(m6502 *this)

{
  uint8_t uVar1;
  uint uVar2;
  ushort uVar3;
  
  if ((char)this->status < '\0') {
    uVar1 = this->cycles;
    this->cycles = uVar1 + '\x01';
    uVar2._0_2_ = this->pc;
    uVar2._2_1_ = this->status;
    uVar2._3_1_ = this->field_0x7;
    uVar3 = this->addrRel + (undefined2)uVar2;
    this->addrAbs = uVar3;
    if (0xff < ((uVar2 ^ uVar3) & 0xffff)) {
      this->cycles = uVar1 + '\x02';
    }
    this->pc = uVar3;
  }
  return '\0';
}

Assistant:

uint8_t GetFlag(FLAGS_6502 flag) { return ((status & flag) > 0) ? 1 : 0; }